

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

void BoostLexicalCastOnStack(void)

{
  uniform_int_distribution<int> *__param;
  char *pcVar1;
  long lVar2;
  type tVar3;
  char *pcVar4;
  long lVar5;
  ostream *poVar6;
  char *tmp_finish;
  int iVar7;
  undefined1 local_1408 [8];
  random_device _rdev;
  uniform_int_distribution<int> _dist;
  undefined8 local_68;
  undefined1 *local_60;
  char *local_58;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> local_50;
  long local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"boost::lexical_cast on stack",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
  std::ostream::flush();
  std::random_device::random_device((random_device *)local_1408);
  __param = (uniform_int_distribution<int> *)((long)&_rdev.field_0 + 0x1380);
  _rdev.field_0._4992_8_ = 0x7fffffff80000000;
  local_38 = std::chrono::_V2::steady_clock::now();
  iVar7 = 10000000;
  pcVar1 = (char *)((long)&local_68 + 7);
  while( true ) {
    tVar3 = std::uniform_int_distribution<int>::operator()
                      (__param,(random_device *)local_1408,(param_type *)__param);
    local_60 = (undefined1 *)((long)&_dist._M_param._M_a + 2);
    local_50.m_value = -tVar3;
    if (0 < (int)tVar3) {
      local_50.m_value = tVar3;
    }
    local_50.m_czero = '0';
    local_50.m_zero = 0x30;
    local_58 = pcVar1;
    local_50.m_finish = pcVar1;
    pcVar4 = boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                       (&local_50);
    if ((int)tVar3 < 0) {
      pcVar4[-1] = '-';
      pcVar4 = pcVar4 + -1;
    }
    if (0x3f < (ulong)((long)pcVar1 - (long)pcVar4)) break;
    iVar7 = iVar7 + -1;
    if (iVar7 == 0) {
      lVar5 = std::chrono::_V2::steady_clock::now();
      std::random_device::_M_fini();
      lVar2 = std::cout;
      *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 3;
      poVar6 = std::ostream::_M_insert<double>((double)(lVar5 - local_38) / 1000000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"s",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      return;
    }
  }
  _dist._M_param = (param_type)&PTR__bad_cast_0010fd30;
  local_68 = &std::array<char,64ul>::typeinfo;
  boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&_dist);
}

Assistant:

void BoostLexicalCastOnStack()
{
    typedef std::array<char, 64> buf_t;
    RANDOM_PROFILING_BEGIN("boost::lexical_cast on stack")
    buf_t buf = boost::lexical_cast<buf_t>(i);
    RANDOM_PROFILING_END()
}